

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeLiteGenerator::GetCleanCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  string local_30;
  
  GetBuildCommand_abi_cxx11_(&local_30,this,mf);
  std::operator+(__return_storage_ptr__,&local_30," clean");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraCodeLiteGenerator::GetCleanCommand(const cmMakefile* mf) const
{
  return GetBuildCommand(mf) + " clean";
}